

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

Color GetPixelColor(void *srcPtr,int format)

{
  uchar uVar1;
  Color local_2c;
  Color local_24;
  Color local_20;
  int format_local;
  void *srcPtr_local;
  Color col;
  
  srcPtr_local._4_1_ = '\0';
  srcPtr_local._5_1_ = '\0';
  srcPtr_local._6_1_ = '\0';
  srcPtr_local._7_1_ = '\0';
  switch(format) {
  case 1:
    local_20.g = *srcPtr;
    local_20.r = *srcPtr;
    local_20.b = *srcPtr;
    local_20.a = 0xff;
    srcPtr_local._4_4_ = local_20;
    break;
  case 2:
    local_24.g = *srcPtr;
    local_24.r = *srcPtr;
    local_24.b = *srcPtr;
    local_24.a = *(uchar *)((long)srcPtr + 1);
    srcPtr_local._4_4_ = local_24;
    break;
  case 3:
    srcPtr_local._4_4_ =
         (Color)CONCAT13(0xff,CONCAT12((char)((ulong)((*srcPtr & 0x1f) * 0xff) / 0x1f),
                                       CONCAT11((char)((ulong)(((int)(uint)*srcPtr >> 5 & 0x3fU) *
                                                              0xff) / 0x3f),
                                                (char)((uint)(((int)(uint)*srcPtr >> 0xb) * 0xff) /
                                                      0x1f))));
    break;
  case 4:
    local_2c.a = 0xff;
    local_2c._0_3_ = *srcPtr;
    srcPtr_local._4_4_ = local_2c;
    break;
  case 5:
    srcPtr_local._5_1_ = (char)((ulong)(((int)(uint)*srcPtr >> 6 & 0x1fU) * 0xff) / 0x1f);
    srcPtr_local._4_1_ = (char)((uint)(((int)(uint)*srcPtr >> 0xb) * 0xff) / 0x1f);
    srcPtr_local._6_1_ = (char)((ulong)((*srcPtr & 0x1f) * 0xff) / 0x1f);
    uVar1 = '\0';
    if ((*srcPtr & 1) != 0) {
      uVar1 = 0xff;
    }
    srcPtr_local._7_1_ = uVar1;
    break;
  case 6:
    srcPtr_local._5_1_ = (char)((ulong)(((int)(uint)*srcPtr >> 8 & 0xfU) * 0xff) / 0xf);
    srcPtr_local._4_1_ = (char)((uint)(((int)(uint)*srcPtr >> 0xc) * 0xff) / 0xf);
    srcPtr_local._6_1_ = (char)((ulong)(((int)(uint)*srcPtr >> 4 & 0xfU) * 0xff) / 0xf);
    srcPtr_local._7_1_ = (uchar)((ulong)((*srcPtr & 0xf) * 0xff) / 0xf);
    break;
  case 7:
    srcPtr_local._4_4_ = *srcPtr;
  }
  return srcPtr_local._4_4_;
}

Assistant:

Color GetPixelColor(void *srcPtr, int format)
{
    Color col = { 0 };

    switch (format)
    {
        case PIXELFORMAT_UNCOMPRESSED_GRAYSCALE: col = (Color){ ((unsigned char *)srcPtr)[0], ((unsigned char *)srcPtr)[0], ((unsigned char *)srcPtr)[0], 255 }; break;
        case PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA: col = (Color){ ((unsigned char *)srcPtr)[0], ((unsigned char *)srcPtr)[0], ((unsigned char *)srcPtr)[0], ((unsigned char *)srcPtr)[1] }; break;
        case PIXELFORMAT_UNCOMPRESSED_R5G6B5:
        {
            col.r = (unsigned char)((((unsigned short *)srcPtr)[0] >> 11)*255/31);
            col.g = (unsigned char)(((((unsigned short *)srcPtr)[0] >> 5) & 0b0000000000111111)*255/63);
            col.b = (unsigned char)((((unsigned short *)srcPtr)[0] & 0b0000000000011111)*255/31);
            col.a = 255;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R5G5B5A1:
        {
            col.r = (unsigned char)((((unsigned short *)srcPtr)[0] >> 11)*255/31);
            col.g = (unsigned char)(((((unsigned short *)srcPtr)[0] >> 6) & 0b0000000000011111)*255/31);
            col.b = (unsigned char)((((unsigned short *)srcPtr)[0] & 0b0000000000011111)*255/31);
            col.a = (((unsigned short *)srcPtr)[0] & 0b0000000000000001)? 255 : 0;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R4G4B4A4:
        {
            col.r = (unsigned char)((((unsigned short *)srcPtr)[0] >> 12)*255/15);
            col.g = (unsigned char)(((((unsigned short *)srcPtr)[0] >> 8) & 0b0000000000001111)*255/15);
            col.b = (unsigned char)(((((unsigned short *)srcPtr)[0] >> 4) & 0b0000000000001111)*255/15);
            col.a = (unsigned char)((((unsigned short *)srcPtr)[0] & 0b0000000000001111)*255/15);

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R8G8B8A8: col = (Color){ ((unsigned char *)srcPtr)[0], ((unsigned char *)srcPtr)[1], ((unsigned char *)srcPtr)[2], ((unsigned char *)srcPtr)[3] }; break;
        case PIXELFORMAT_UNCOMPRESSED_R8G8B8: col = (Color){ ((unsigned char *)srcPtr)[0], ((unsigned char *)srcPtr)[1], ((unsigned char *)srcPtr)[2], 255 }; break;
        // TODO: case PIXELFORMAT_UNCOMPRESSED_R32: break;
        // TODO: case PIXELFORMAT_UNCOMPRESSED_R32G32B32: break;
        // TODO: case PIXELFORMAT_UNCOMPRESSED_R32G32B32A32: break;
        default: break;
    }

    return col;
}